

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O0

size_t err_format_msg(char *outbuf,size_t outbuflen,char *msg,CVmException *exc)

{
  char cVar1;
  uint uVar2;
  unsigned_long uVar3;
  CVmException *in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  bool bVar4;
  int use_strlen;
  size_t len;
  err_param_type typ;
  char srcbuf [30];
  char *src;
  size_t rem;
  size_t need;
  int exc_argc;
  char *dst;
  char *p;
  int curarg;
  int local_a0;
  ulong local_98;
  err_param_type local_8c;
  char local_88;
  char local_87;
  undefined1 local_86;
  char *local_60;
  ulong local_58;
  size_t local_50;
  int local_44;
  char *local_40;
  char *local_38;
  int local_2c;
  CVmException *local_28;
  char *local_20;
  ulong local_18;
  char *local_10;
  size_t local_8;
  
  local_50 = 0;
  local_58 = in_RSI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RCX == (CVmException *)0x0) {
    local_a0 = 0;
  }
  else {
    local_a0 = CVmException::get_param_count(in_RCX);
  }
  local_44 = local_a0;
  local_2c = 0;
  local_40 = local_10;
  if (local_20 == (char *)0x0) {
    local_8 = local_50 + 1;
    if (local_18 != 0) {
      *local_10 = '\0';
    }
  }
  else {
    for (local_38 = local_20; *local_38 != '\0'; local_38 = local_38 + 1) {
      if (*local_38 == '%') {
        if (local_2c < local_44) {
          local_8c = CVmException::get_param_type(local_28,local_2c);
          bVar4 = true;
          local_38 = local_38 + 1;
          cVar1 = *local_38;
          if (cVar1 == '%') {
            local_60 = "%";
          }
          else if (cVar1 == 'd') {
            local_60 = &local_88;
            if (local_8c == ERR_TYPE_INT) {
              uVar2 = CVmException::get_param_int(local_28,local_2c);
              sprintf(&local_88,"%d",(ulong)uVar2);
            }
            else if (local_8c == ERR_TYPE_ULONG) {
              uVar3 = CVmException::get_param_ulong(local_28,local_2c);
              sprintf(&local_88,"%ld",uVar3);
            }
            else {
              local_60 = "d";
            }
          }
          else if (cVar1 == 's') {
            if (local_8c == ERR_TYPE_TEXTCHAR) {
              local_60 = CVmException::get_param_text(local_28,local_2c);
            }
            else if (local_8c == ERR_TYPE_CHAR) {
              local_60 = CVmException::get_param_char(local_28,local_2c);
            }
            else {
              bVar4 = local_8c != ERR_TYPE_CHAR_LEN;
              if (bVar4) {
                local_60 = "s";
              }
              else {
                local_60 = CVmException::get_param_char_len(local_28,local_2c,&local_98);
              }
            }
          }
          else if (cVar1 == 'u') {
            local_60 = &local_88;
            if (local_8c == ERR_TYPE_INT) {
              uVar2 = CVmException::get_param_int(local_28,local_2c);
              sprintf(&local_88,"%u",(ulong)uVar2);
            }
            else if (local_8c == ERR_TYPE_ULONG) {
              uVar3 = CVmException::get_param_ulong(local_28,local_2c);
              sprintf(&local_88,"%lu",uVar3);
            }
            else {
              local_60 = "u";
            }
          }
          else if (cVar1 == 'x') {
            local_60 = &local_88;
            if (local_8c == ERR_TYPE_INT) {
              uVar2 = CVmException::get_param_int(local_28,local_2c);
              sprintf(&local_88,"%x",(ulong)uVar2);
            }
            else if (local_8c == ERR_TYPE_ULONG) {
              uVar3 = CVmException::get_param_ulong(local_28,local_2c);
              sprintf(&local_88,"%lx",uVar3);
            }
            else {
              local_60 = "x";
            }
          }
          else {
            local_60 = &local_88;
            local_88 = '%';
            local_87 = *local_38;
            local_86 = 0;
          }
          if (bVar4) {
            local_98 = strlen(local_60);
          }
          local_50 = local_98 + local_50;
          if (1 < local_58) {
            if (local_58 - 1 < local_98) {
              local_98 = local_58 - 1;
            }
            memcpy(local_40,local_60,local_98);
            local_40 = local_40 + local_98;
            local_58 = local_58 - local_98;
          }
          local_2c = local_2c + 1;
        }
        else {
          local_50 = local_50 + 1;
          if (1 < local_58) {
            local_58 = local_58 - 1;
            *local_40 = *local_38;
            local_40 = local_40 + 1;
          }
        }
      }
      else {
        local_50 = local_50 + 1;
        if (1 < local_58) {
          local_58 = local_58 - 1;
          *local_40 = *local_38;
          local_40 = local_40 + 1;
        }
      }
    }
    if (local_58 != 0) {
      *local_40 = '\0';
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

size_t err_format_msg(char *outbuf, size_t outbuflen,
                      const char *msg, const CVmException *exc)
{
    int curarg;
    const char *p;
    char *dst;
    int exc_argc;
    size_t need = 0;
    size_t rem = outbuflen;

    /* get the number of parameters in the exception object */
    exc_argc = (exc == 0 ? 0 : exc->get_param_count());

    /* start with the first parameter */
    curarg = 0;

    /* start at the beginning of the buffer */
    dst = outbuf;

    /* if there's no message, there's nothing to return */
    if (msg == 0)
    {
        ++need;
        if (outbuflen != 0)
            *dst = '\0';
        return need;
    }

    /* scan the format string for formatting codes */
    for (p = msg ; *p != '\0' ; ++p)
    {
        /* if it's a format specifier, translate it */
        if (*p == '%')
        {
            const char *src;
            char srcbuf[30];
            err_param_type typ;
            size_t len;
            int use_strlen;
            
            /* 
             *   if no more parameters are available, ignore the
             *   formatting code entirely, and leave it in the string as
             *   it is 
             */
            if (curarg >= exc_argc)
            {
                ++need;
                if (rem > 1)
                    --rem, *dst++ = *p;
                continue;
            }

            /* get the type of the current parameter */
            typ = exc->get_param_type(curarg);
            
            /* 
             *   presume we'll want to use strlen to get the length of the
             *   source value 
             */
            use_strlen = TRUE;
            
            /* skip the '%' and determine what follows */
            ++p;
            switch (*p)
            {
            case 's':
                /* get the string value using the appropriate type */
                if (typ == ERR_TYPE_TEXTCHAR)
                    src = exc->get_param_text(curarg);
                else if (typ == ERR_TYPE_CHAR)
                    src = exc->get_param_char(curarg);
                else if (typ == ERR_TYPE_CHAR_LEN)
                {
                    /* get the string value and its length */
                    src = exc->get_param_char_len(curarg, &len);

                    /* 
                     *   src isn't null terminated, so don't use strlen to
                     *   get its length - we already have it from the
                     *   parameter data 
                     */
                    use_strlen = FALSE;
                }
                else
                    src = "s";
                break;

            case 'd':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%d", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%ld", exc->get_param_ulong(curarg));
                else
                    src = "d";
                break;

            case 'u':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%u", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%lu", exc->get_param_ulong(curarg));
                else
                    src = "u";
                break;

            case 'x':
                src = srcbuf;
                if (typ == ERR_TYPE_INT)
                    sprintf(srcbuf, "%x", exc->get_param_int(curarg));
                else if (typ == ERR_TYPE_ULONG)
                    sprintf(srcbuf, "%lx", exc->get_param_ulong(curarg));
                else
                    src = "x";
                break;

            case '%':
                /* add a single percent sign */
                src = "%";
                break;

            default:
                /* invalid format character; leave the whole thing intact */
                src = srcbuf;
                srcbuf[0] = '%';
                srcbuf[1] = *p;
                srcbuf[2] = '\0';
                break;
            }

            /* get the length, if it's null-terminated */
            if (use_strlen)
                len = strlen(src);

            /* count the full 'len' in our space needs */
            need +=len;

            /* copy as much as we can */
            if (rem > 1)
            {
                /* limit it to the remaining space, minus a null byte */
                if (len > rem - 1)
                    len = rem - 1;

                /* copy the value and advance past it in the output buffer */
                memcpy(dst, src, len);
                dst += len;
                rem -= len;
            }

            /* consume the argument */
            ++curarg;
        }
        else
        {
            /* just copy the current character as it is */
            ++need;
            if (rem > 1)
                --rem, *dst++ = *p;
        }
    }

    /* add the trailing null */
    if (rem != 0)
        *dst++ = '\0';

    /* return the space required */
    return need;
}